

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderGLImpl.cpp
# Opt level: O1

void __thiscall Diligent::ShaderGLImpl::CompileShader(ShaderGLImpl *this)

{
  array<int,_1UL> Lengths;
  array<const_char_*,_1UL> ShaderStrings;
  GLint local_14;
  pointer local_10;
  
  local_10 = (this->m_GLSLSourceString)._M_dataplus._M_p;
  local_14 = (GLint)(this->m_GLSLSourceString)._M_string_length;
  (*__glewShaderSource)((this->m_GLShaderObj).m_uiHandle,1,&local_10,&local_14);
  (*__glewCompileShader)((this->m_GLShaderObj).m_uiHandle);
  return;
}

Assistant:

void ShaderGLImpl::CompileShader() noexcept
{
    // Note: there is a simpler way to create the program:
    //m_uiShaderSeparateProg = glCreateShaderProgramv(GL_VERTEX_SHADER, _countof(ShaderStrings), ShaderStrings);
    // NOTE: glCreateShaderProgramv() is considered equivalent to both a shader compilation and a program linking
    // operation. Since it performs both at the same time, compiler or linker errors can be encountered. However,
    // since this function only returns a program object, compiler-type errors will be reported as linker errors
    // through the following API:
    // GLint isLinked = 0;
    // glGetProgramiv(program, GL_LINK_STATUS, &isLinked);
    // The log can then be queried in the same way


    // Each element in the length array may contain the length of the corresponding string
    // (the null character is not counted as part of the string length).
    // Not specifying lengths causes shader compilation errors on Android
    std::array<const char*, 1> ShaderStrings = {};
    std::array<GLint, 1>       Lengths       = {};

    ShaderStrings[0] = m_GLSLSourceString.c_str();
    Lengths[0]       = static_cast<GLint>(m_GLSLSourceString.length());

    // Provide source strings (the strings will be saved in internal OpenGL memory)
    glShaderSource(m_GLShaderObj, static_cast<GLsizei>(ShaderStrings.size()), ShaderStrings.data(), Lengths.data());
    // When the shader is compiled, it will be compiled as if all of the given strings were concatenated end-to-end.
    glCompileShader(m_GLShaderObj);
}